

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void google::protobuf::anon_unknown_9::ByteSizeConsistencyError
               (int byte_size_before_serialization,int byte_size_after_serialization,
               int bytes_produced_by_serialization)

{
  LogMessage *pLVar1;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (byte_size_before_serialization != byte_size_after_serialization) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x3f);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"Protocol message was modified concurrently during serialization.");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (bytes_produced_by_serialization != byte_size_before_serialization) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x41);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_90,
                        "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of the message."
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  internal::LogMessage::LogMessage
            (&local_c8,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x45);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_c8,"This shouldn\'t be called if all the sizes are equal.");
  internal::LogFinisher::operator=(&local_c9,pLVar1);
  internal::LogMessage::~LogMessage(&local_c8);
  return;
}

Assistant:

void ByteSizeConsistencyError(int byte_size_before_serialization,
                              int byte_size_after_serialization,
                              int bytes_produced_by_serialization) {
  GOOGLE_CHECK_EQ(byte_size_before_serialization, byte_size_after_serialization)
      << "Protocol message was modified concurrently during serialization.";
  GOOGLE_CHECK_EQ(bytes_produced_by_serialization, byte_size_before_serialization)
      << "Byte size calculation and serialization were inconsistent.  This "
         "may indicate a bug in protocol buffers or it may be caused by "
         "concurrent modification of the message.";
  GOOGLE_LOG(FATAL) << "This shouldn't be called if all the sizes are equal.";
}